

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

Entry * __thiscall
Lib::
DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntryToInsert(DHMap<Kernel::Unit_*,_std::unique_ptr<Lib::InferenceExtra,_std::default_delete<Lib::InferenceExtra>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
                    *this,Unit **key)

{
  Unit *pUVar1;
  type tVar2;
  Entry *pEVar3;
  ulong uVar4;
  uint uVar5;
  
  ensureExpanded(this);
  tVar2 = DefaultHash::hash<Kernel::Unit>(*key);
  uVar4 = (ulong)tVar2 % (ulong)(uint)this->_capacity;
  pEVar3 = this->_entries + (int)uVar4;
  uVar5 = this->_entries[(int)uVar4].field_0._infoData;
  if ((uVar5 >> 2 == this->_timestamp) && (pEVar3->_key != *key)) {
    (pEVar3->field_0)._infoData = uVar5 | 2;
    pUVar1 = *key;
    if (pUVar1 == (Unit *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = pUVar1->_number;
    }
    uVar5 = uVar5 % (uint)this->_capacity;
    do {
      uVar4 = (ulong)((int)uVar4 + uVar5 + (uVar5 == 0)) % (ulong)(uint)this->_capacity;
      pEVar3 = this->_entries + (int)uVar4;
      if ((uint)this->_entries[(int)uVar4].field_0._infoData >> 2 != this->_timestamp) {
        return pEVar3;
      }
    } while (pEVar3->_key != pUVar1);
  }
  return pEVar3;
}

Assistant:

Entry* findEntryToInsert(Key const& key)
  {
    ensureExpanded();
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    int pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp || res->_key==key) {
      return res;
    }

    //We have a collision...

    //mark the entry where the collision occured
    res->_info.collision=1;

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);
    return res;
  }